

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall pstore::stderr_logger::~stderr_logger(stderr_logger *this)

{
  stderr_logger *this_local;
  
  ~stderr_logger(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

stderr_logger::~stderr_logger () noexcept = default;